

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_clm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  
  if (((s->fields).presentO & 0x10) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    pTVar1 = tcg_const_i32_s390x(tcg_ctx,(s->fields).c[2]);
    ts = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_extrl_i64_i32_s390x(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),o->in1);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = o->in2 + (long)tcg_ctx;
    local_40 = ts;
    local_38 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_clm,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,&local_48);
    set_cc_static(s);
    tcg_temp_free_internal_s390x(tcg_ctx,ts);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_clm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 m3 = tcg_const_i32(tcg_ctx, get_field(s, m3));
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, t1, o->in1);
    gen_helper_clm(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, t1, m3, o->in2);
    set_cc_static(s);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, m3);
    return DISAS_NEXT;
}